

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O3

void __thiscall
nvim::Nvim::async_tabpage_set_var(Nvim *this,Tabpage tabpage,string *name,Object *value)

{
  string local_58;
  Tabpage local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = tabpage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"nvim_tabpage_set_var","");
  NvimRPC::
  async_call<long,std::__cxx11::string,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>
            (&this->client_,&local_58,&local_38,name,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::async_tabpage_set_var(Tabpage tabpage, const std::string& name, const Object& value) {
    client_.async_call("nvim_tabpage_set_var", tabpage, name, value);
}